

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O2

bool subhomedir(char *dst,int len,char *src)

{
  char *pcVar1;
  char *s;
  bool bVar2;
  
  pcVar1 = strstr(src,"$HOME");
  if ((pcVar1 == (char *)0x0) && (pcVar1 = strchr(src,0x7e), pcVar1 == (char *)0x0)) {
    return true;
  }
  bVar2 = true;
  if ((long)pcVar1 - (long)src < (long)len) {
    s = getenv("HOME");
    if ((s == (char *)0x0) || (*s == '\0')) {
      bVar2 = false;
    }
    else {
      dst[(long)pcVar1 - (long)src] = '\0';
      concatstring(dst,s,0x104);
      concatstring(dst,pcVar1 + (ulong)(*pcVar1 != '~') * 4 + 1,0x104);
    }
  }
  return bVar2;
}

Assistant:

bool subhomedir(char *dst, int len, const char *src)
{
    const char *sub = strstr(src, "$HOME");
    if(!sub) sub = strchr(src, '~');
    if(sub && sub-src < len)
    {
#ifdef WIN32
        char home[MAX_PATH+1];
        home[0] = '\0';
        if(SHGetFolderPath(NULL, CSIDL_PERSONAL, NULL, 0, home) != S_OK || !home[0]) return false;
#else
        const char *home = getenv("HOME");
        if(!home || !home[0]) return false;
#endif
        dst[sub-src] = '\0';
        concatstring(dst, home);
        concatstring(dst, sub+(*sub == '~' ? 1 : strlen("$HOME")));
    }
    return true;
}